

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverFactory.cpp
# Opt level: O2

Bool __thiscall
Diligent::anon_unknown_0::ArchiverFactoryImpl::AppendDeviceData
          (ArchiverFactoryImpl *this,IDataBlob *pSrcArchive,ARCHIVE_DEVICE_DATA_FLAGS DeviceFlags,
          IDataBlob *pDeviceArchive,IDataBlob **ppDstArchive)

{
  IDataBlob *pIVar1;
  DeviceType Dev;
  string msg;
  DeviceObjectArchive DevObjectArchive;
  DeviceObjectArchive local_218;
  CreateInfo local_128;
  undefined1 local_118 [240];
  
  if (pSrcArchive == (IDataBlob *)0x0) {
    FormatString<char[29]>((string *)&local_218,(char (*) [29])"pSrcArchive must not be null");
    DebugAssertionFailed
              ((Char *)local_218.m_NamedResources._M_h._M_buckets,"AppendDeviceData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
               ,0x102);
  }
  else if (pDeviceArchive == (IDataBlob *)0x0) {
    FormatString<char[32]>((string *)&local_218,(char (*) [32])"pDeviceArchive must not be null");
    DebugAssertionFailed
              ((Char *)local_218.m_NamedResources._M_h._M_buckets,"AppendDeviceData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
               ,0x107);
  }
  else {
    if (ppDstArchive != (IDataBlob **)0x0) {
      if (*ppDstArchive != (IDataBlob *)0x0) {
        FormatString<char[27]>((string *)&local_218,(char (*) [27])"*ppDstArchive must be null");
        DebugAssertionFailed
                  ((Char *)local_218.m_NamedResources._M_h._M_buckets,"AppendDeviceData",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
                   ,0x10f);
        std::__cxx11::string::~string((string *)&local_218);
      }
      local_118._8_4_ = 0xffffffff;
      local_118[0xc] = false;
      local_118._0_8_ = pSrcArchive;
      DeviceObjectArchive::DeviceObjectArchive(&local_218,(CreateInfo *)local_118);
      local_128.ContentVersion = 0xffffffff;
      local_128.MakeCopy = false;
      local_128.pData = pDeviceArchive;
      DeviceObjectArchive::DeviceObjectArchive((DeviceObjectArchive *)local_118,&local_128);
      for (; DeviceFlags != ARCHIVE_DEVICE_DATA_FLAG_NONE;
          DeviceFlags = DeviceFlags ^ -DeviceFlags & DeviceFlags) {
        Dev = ArchiveDeviceDataFlagToArchiveDeviceType(-DeviceFlags & DeviceFlags);
        DeviceObjectArchive::AppendDeviceData(&local_218,(DeviceObjectArchive *)local_118,Dev);
      }
      DeviceObjectArchive::Serialize(&local_218,ppDstArchive);
      pIVar1 = *ppDstArchive;
      DeviceObjectArchive::~DeviceObjectArchive((DeviceObjectArchive *)local_118);
      DeviceObjectArchive::~DeviceObjectArchive(&local_218);
      return pIVar1 != (IDataBlob *)0x0;
    }
    FormatString<char[30]>((string *)&local_218,(char (*) [30])"ppDstArchive must not be null");
    DebugAssertionFailed
              ((Char *)local_218.m_NamedResources._M_h._M_buckets,"AppendDeviceData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
               ,0x10c);
  }
  std::__cxx11::string::~string((string *)&local_218);
  return false;
}

Assistant:

Bool ArchiverFactoryImpl::AppendDeviceData(const IDataBlob*          pSrcArchive,
                                           ARCHIVE_DEVICE_DATA_FLAGS DeviceFlags,
                                           const IDataBlob*          pDeviceArchive,
                                           IDataBlob**               ppDstArchive) const
{
    if (pSrcArchive == nullptr)
    {
        DEV_ERROR("pSrcArchive must not be null");
        return false;
    }
    if (pDeviceArchive == nullptr)
    {
        DEV_ERROR("pDeviceArchive must not be null");
        return false;
    }
    if (ppDstArchive == nullptr)
    {
        DEV_ERROR("ppDstArchive must not be null");
        return false;
    }
    DEV_CHECK_ERR(*ppDstArchive == nullptr, "*ppDstArchive must be null");

    try
    {
        DeviceObjectArchive       ObjectArchive{DeviceObjectArchive::CreateInfo{pSrcArchive}};
        const DeviceObjectArchive DevObjectArchive{DeviceObjectArchive::CreateInfo{pDeviceArchive}};

        while (DeviceFlags != ARCHIVE_DEVICE_DATA_FLAG_NONE)
        {
            const auto DataTypeFlag      = ExtractLSB(DeviceFlags);
            const auto ArchiveDeviceType = ArchiveDeviceDataFlagToArchiveDeviceType(DataTypeFlag);

            ObjectArchive.AppendDeviceData(DevObjectArchive, ArchiveDeviceType);
        }

        ObjectArchive.Serialize(ppDstArchive);
        return *ppDstArchive != nullptr;
    }
    catch (...)
    {
        return false;
    }
}